

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

QList<QTableWidgetSelectionRange> * __thiscall QTableWidget::selectedRanges(QTableWidget *this)

{
  long lVar1;
  int right;
  qsizetype qVar2;
  QList<QTableWidgetSelectionRange> *in_RSI;
  QList<QTableWidgetSelectionRange> *in_RDI;
  long in_FS_OFFSET;
  int i;
  int rangesCount;
  QList<QTableWidgetSelectionRange> *result;
  QList<QItemSelectionRange> ranges;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int local_64;
  QTableWidgetSelectionRange local_48 [2];
  Data *local_20;
  QItemSelectionRange *asize;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  asize = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::selectionModel
            ((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  QItemSelectionModel::selection();
  QList<QItemSelectionRange>::QList
            ((QList<QItemSelectionRange> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (QList<QItemSelectionRange> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  QItemSelection::~QItemSelection((QItemSelection *)0x8dba57);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QTableWidgetSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTableWidgetSelectionRange>::QList((QList<QTableWidgetSelectionRange> *)0x8dba86);
  qVar2 = QList<QItemSelectionRange>::size((QList<QItemSelectionRange> *)&local_20);
  QList<QTableWidgetSelectionRange>::reserve(in_RSI,(qsizetype)asize);
  for (local_64 = 0; local_64 < (int)qVar2; local_64 = local_64 + 1) {
    QList<QItemSelectionRange>::at
              ((QList<QItemSelectionRange> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    in_stack_ffffffffffffff7c = QItemSelectionRange::top((QItemSelectionRange *)0x8dbad0);
    QList<QItemSelectionRange>::at
              ((QList<QItemSelectionRange> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    in_stack_ffffffffffffff80 = QItemSelectionRange::left((QItemSelectionRange *)0x8dbaeb);
    QList<QItemSelectionRange>::at
              ((QList<QItemSelectionRange> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    in_stack_ffffffffffffff84 = QItemSelectionRange::bottom((QItemSelectionRange *)0x8dbb06);
    QList<QItemSelectionRange>::at
              ((QList<QItemSelectionRange> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    right = QItemSelectionRange::right((QItemSelectionRange *)0x8dbb21);
    QTableWidgetSelectionRange::QTableWidgetSelectionRange
              (local_48,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff84,right);
    QList<QTableWidgetSelectionRange>::append
              ((QList<QTableWidgetSelectionRange> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (rvalue_ref)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  QList<QItemSelectionRange>::~QList((QList<QItemSelectionRange> *)0x8dbb79);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<QTableWidgetSelectionRange> QTableWidget::selectedRanges() const
{
    const QList<QItemSelectionRange> ranges = selectionModel()->selection();
    QList<QTableWidgetSelectionRange> result;
    const int rangesCount = ranges.size();
    result.reserve(rangesCount);
    for (int i = 0; i < rangesCount; ++i)
        result.append({ranges.at(i).top(),
                       ranges.at(i).left(),
                       ranges.at(i).bottom(),
                       ranges.at(i).right()});
    return result;
}